

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

wrapper<std::shared_ptr<i1>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_impl1_2_*>_>
 __thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl1_2,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
::
create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,std::shared_ptr<i1>,boost::ext::di::v1_3_0::no_name>
          (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl1_2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
           *this)

{
  wrapper_conflict4 wVar1;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl1_2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *in_RDI;
  dependency__<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl1_2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *creatable_dept;
  dependency<boost::ext::di::v1_3_0::scopes::unique,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl1_2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *dependency;
  
  binder::
  resolve<std::shared_ptr<i1>,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,i1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl1_2,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>
            (in_RDI);
  wVar1 = scopes::unique::scope<boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl1_2>::
          create<std::shared_ptr<i1>,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl1_2,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,boost::ext::di::v1_3_0::concepts::any_of<i1,i2>,impl1_2,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
                    ((scope<boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl1_2> *)in_RDI,
                     (provider<boost::ext::di::v1_3_0::aux::pair<impl1_2,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::unique,_boost::ext::di::v1_3_0::concepts::any_of<i1,_i2>,_impl1_2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
                      *)in_RDI);
  return (wrapper<std::shared_ptr<i1>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_impl1_2_*>_>
          )(unique<boost::ext::di::v1_3_0::scopes::unique,_impl1_2_*>)wVar1.object;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }